

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall aeron::ClientConductor::onCheckManagedResources(ClientConductor *this,longlong now)

{
  pointer pLVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ImageListLingerDefn *pIVar3;
  pointer pIVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ImageList *pIVar7;
  bool bVar8;
  int iVar9;
  pointer pLVar10;
  long lVar11;
  pointer pLVar12;
  iterator __first;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  _Var13;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  _Var14;
  pointer pIVar15;
  longlong local_50;
  ClientConductor *local_48;
  longlong local_40;
  ClientConductor *local_38;
  
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  pLVar12 = (this->m_lingeringLogBuffers).
            super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->m_lingeringLogBuffers).
           super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = ((long)pLVar1 - (long)pLVar12 >> 3) * -0x5555555555555555 >> 2;
  pLVar10 = pLVar12;
  if (0 < lVar11) {
    lVar2 = this->m_resourceLingerTimeoutMs;
    pLVar10 = pLVar12 + lVar11 * 4;
    lVar11 = lVar11 + 1;
    __first._M_current = pLVar12 + 2;
    do {
      if (__first._M_current[-2].m_timeOfLastStatusChange + lVar2 < now) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00143593;
      }
      if (__first._M_current[-1].m_timeOfLastStatusChange + lVar2 < now) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00143593;
      }
      if ((__first._M_current)->m_timeOfLastStatusChange + lVar2 < now) goto LAB_00143593;
      if (__first._M_current[1].m_timeOfLastStatusChange + lVar2 < now) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00143593;
      }
      lVar11 = lVar11 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar11);
  }
  lVar11 = ((long)pLVar1 - (long)pLVar10 >> 3) * -0x5555555555555555;
  if (lVar11 == 1) {
LAB_0014356d:
    __first._M_current = pLVar10;
    if (now <= this->m_resourceLingerTimeoutMs + pLVar10->m_timeOfLastStatusChange) {
      __first._M_current = pLVar1;
    }
  }
  else if (lVar11 == 2) {
LAB_0014355a:
    __first._M_current = pLVar10;
    if (now <= this->m_resourceLingerTimeoutMs + pLVar10->m_timeOfLastStatusChange) {
      pLVar10 = pLVar10 + 1;
      goto LAB_0014356d;
    }
  }
  else {
    __first._M_current = pLVar1;
    if ((lVar11 == 3) &&
       (__first._M_current = pLVar10,
       now <= this->m_resourceLingerTimeoutMs + pLVar10->m_timeOfLastStatusChange)) {
      pLVar10 = pLVar10 + 1;
      goto LAB_0014355a;
    }
  }
LAB_00143593:
  pLVar12 = __first._M_current;
  if (__first._M_current != pLVar1) {
    while (pLVar10 = pLVar12, pLVar12 = pLVar10 + 1, pLVar12 != pLVar1) {
      if (now <= this->m_resourceLingerTimeoutMs + pLVar12->m_timeOfLastStatusChange) {
        (__first._M_current)->m_timeOfLastStatusChange = pLVar12->m_timeOfLastStatusChange;
        peVar5 = pLVar10[1].m_logBuffers.
                 super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = pLVar10[1].m_logBuffers.
                 super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        pLVar10[1].m_logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        pLVar10[1].m_logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = ((__first._M_current)->m_logBuffers).
                  super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((__first._M_current)->m_logBuffers).
        super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
        ((__first._M_current)->m_logBuffers).
        super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var6
        ;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        __first._M_current = __first._M_current + 1;
      }
    }
  }
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::_M_erase(&this->m_lingeringLogBuffers,__first,
             (this->m_lingeringLogBuffers).
             super__Vector_base<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  _Var13._M_current =
       (this->m_lingeringImageLists).
       super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pIVar3 - (long)_Var13._M_current >> 6;
  local_50 = now;
  local_48 = this;
  local_40 = now;
  local_38 = this;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_50,_Var13);
      _Var14._M_current = _Var13._M_current;
      if (bVar8) goto LAB_001436fb;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_50,_Var13._M_current + 1);
      _Var14._M_current = _Var13._M_current + 1;
      if (bVar8) goto LAB_001436fb;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_50,_Var13._M_current + 2);
      _Var14._M_current = _Var13._M_current + 2;
      if (bVar8) goto LAB_001436fb;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_50,_Var13._M_current + 3);
      _Var14._M_current = _Var13._M_current + 3;
      if (bVar8) goto LAB_001436fb;
      _Var13._M_current = _Var13._M_current + 4;
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  lVar11 = (long)pIVar3 - (long)_Var13._M_current >> 4;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      _Var14._M_current = pIVar3;
      if ((lVar11 != 3) ||
         (bVar8 = __gnu_cxx::__ops::
                  _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
                  operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                              *)&local_50,_Var13), _Var14._M_current = _Var13._M_current, bVar8))
      goto LAB_001436fb;
      _Var13._M_current = _Var13._M_current + 1;
    }
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                      ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                        *)&local_50,_Var13);
    _Var14._M_current = _Var13._M_current;
    if (bVar8) goto LAB_001436fb;
    _Var13._M_current = _Var13._M_current + 1;
  }
  bVar8 = __gnu_cxx::__ops::
          _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::operator()
                    ((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1> *)
                     &local_50,_Var13);
  _Var14._M_current = _Var13._M_current;
  if (!bVar8) {
    _Var14._M_current = pIVar3;
  }
LAB_001436fb:
  _Var13._M_current = _Var14._M_current + 1;
  if (_Var13._M_current != pIVar3 && _Var14._M_current != pIVar3) {
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::$_1>::
              operator()((_Iter_pred<aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                          *)&local_40,_Var13);
      if (!bVar8) {
        pIVar7 = (_Var13._M_current)->m_imageList;
        (_Var14._M_current)->m_timeOfLastStatusChange =
             (_Var13._M_current)->m_timeOfLastStatusChange;
        (_Var14._M_current)->m_imageList = pIVar7;
        _Var14._M_current = _Var14._M_current + 1;
      }
      _Var13._M_current = _Var13._M_current + 1;
    } while (_Var13._M_current != pIVar3);
  }
  pIVar3 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var14._M_current != pIVar3) &&
     (pIVar4 = (this->m_lingeringImageLists).
               super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     pIVar15 = (pointer)((long)_Var14._M_current + ((long)pIVar4 - (long)pIVar3)), pIVar4 != pIVar15
     )) {
    (this->m_lingeringImageLists).
    super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar15;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onCheckManagedResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    // erase-remove idiom

    auto logIt = std::remove_if(m_lingeringLogBuffers.begin(), m_lingeringLogBuffers.end(),
        [now, this](const LogBuffersLingerDefn& entry)
        {
            return now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs);
        });

    m_lingeringLogBuffers.erase(logIt, m_lingeringLogBuffers.end());

    auto arrayIt = std::remove_if(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [now, this](ImageListLingerDefn & entry)
        {
            if (now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs))
            {
                delete[] entry.m_imageList->m_images;
                delete entry.m_imageList;
                entry.m_imageList = nullptr;
                return true;
            }

            return false;
        });

    m_lingeringImageLists.erase(arrayIt, m_lingeringImageLists.end());
}